

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_private_class_field(JSParseState *s,JSFunctionDef *fd,JSAtom name,JSVarKindEnum var_kind)

{
  int iVar1;
  long lVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  int idx;
  JSVarDef *vd;
  JSContext *ctx;
  undefined8 in_stack_ffffffffffffffd0;
  
  iVar1 = add_scope_var((JSContext *)CONCAT44(in_EDX,in_ECX),(JSFunctionDef *)*in_RDI,
                        (JSAtom)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                        (JSVarKindEnum)in_stack_ffffffffffffffd0);
  if (-1 < iVar1) {
    lVar2 = *(long *)(in_RSI + 0x90) + (long)iVar1 * 0x10;
    *(uint *)(lVar2 + 0xc) = *(uint *)(lVar2 + 0xc) & 0xfffffffd | 2;
    *(uint *)(lVar2 + 0xc) = *(uint *)(lVar2 + 0xc) & 0xfffffffe | 1;
  }
  return iVar1;
}

Assistant:

static int add_private_class_field(JSParseState *s, JSFunctionDef *fd,
                                   JSAtom name, JSVarKindEnum var_kind)
{
    JSContext *ctx = s->ctx;
    JSVarDef *vd;
    int idx;

    idx = add_scope_var(ctx, fd, name, var_kind);
    if (idx < 0)
        return idx;
    vd = &fd->vars[idx];
    vd->is_lexical = 1;
    vd->is_const = 1;
    return idx;
}